

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O3

void duckdb_je_sec_flush(tsdn_t *tsdn,sec_t *sec)

{
  long *plVar1;
  sec_shard_t *psVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  if ((sec->opts).nshards != 0) {
    lVar4 = 0x48;
    uVar5 = 0;
    do {
      psVar2 = sec->shards;
      iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)&(psVar2->mtx).field_0 + lVar4));
      if (iVar3 != 0) {
        duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)((long)psVar2 + lVar4 + -0x48));
        *(undefined1 *)((long)psVar2 + lVar4 + -8) = 1;
      }
      plVar1 = (long *)((long)psVar2 + lVar4 + -0x10);
      *plVar1 = *plVar1 + 1;
      if (*(tsdn_t **)((long)psVar2 + lVar4 + -0x18) != tsdn) {
        *(tsdn_t **)((long)psVar2 + lVar4 + -0x18) = tsdn;
        plVar1 = (long *)((long)psVar2 + lVar4 + -0x20);
        *plVar1 = *plVar1 + 1;
      }
      sec_flush_all_locked(tsdn,sec,(sec_shard_t *)((long)sec->shards + lVar4 + -0x48));
      psVar2 = sec->shards;
      *(undefined1 *)((long)psVar2 + lVar4 + -8) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(psVar2->mtx).field_0 + lVar4));
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x90;
    } while (uVar5 < (sec->opts).nshards);
  }
  return;
}

Assistant:

void
sec_flush(tsdn_t *tsdn, sec_t *sec) {
	for (size_t i = 0; i < sec->opts.nshards; i++) {
		malloc_mutex_lock(tsdn, &sec->shards[i].mtx);
		sec_flush_all_locked(tsdn, sec, &sec->shards[i]);
		malloc_mutex_unlock(tsdn, &sec->shards[i].mtx);
	}
}